

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts_no_zeroinit.h
# Opt level: O0

void __thiscall
BRTS_XZ<TTA>::PerformLabelingMem
          (BRTS_XZ<TTA> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int iVar1;
  int iVar2;
  Mat1b *pMVar3;
  uint uVar4;
  int *piVar5;
  uint *puVar6;
  reference pvVar7;
  double dVar8;
  Mat_<int> local_2c8;
  allocator<unsigned_long> local_261;
  value_type_conflict2 local_260;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_258;
  uint local_240;
  unsigned_short local_23c;
  unsigned_short local_23a;
  int label;
  unsigned_short end_pos;
  unsigned_short start_pos;
  int j;
  int i;
  Run *runs;
  int h;
  int w;
  undefined1 local_218 [8];
  MemMat<int> img_labels;
  Mat_<unsigned_char> local_140;
  undefined1 local_e0 [8];
  MemMat<unsigned_char> img;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses_local;
  BRTS_XZ<TTA> *this_local;
  
  img.accesses_._88_8_ = accesses;
  cv::Mat_<unsigned_char>::Mat_(&local_140,(this->super_Labeling2D<(Connectivity2D)8,_false>).img_);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_e0,&local_140);
  cv::Mat_<unsigned_char>::~Mat_(&local_140);
  cv::MatSize::operator()((MatSize *)&h);
  MemMat<int>::MemMat((MemMat<int> *)local_218,(Size *)&h,0);
  runs._4_4_ = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  runs._0_4_ = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  Data_Compressed::Alloc(&this->data_compressed,(int)runs,runs._4_4_);
  InitCompressedDataMem(this,&this->data_compressed,(MemMat<unsigned_char> *)local_e0);
  Runs::Alloc(&this->data_runs,(int)runs,runs._4_4_);
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar1 = *(int *)&pMVar3->field_0x8;
  iVar2 = *(int *)&pMVar3->field_0xc;
  TTA::MemAlloc(((iVar1 + 1) - (iVar1 + 1 >> 0x1f) >> 1) * ((iVar2 + 1) - (iVar2 + 1 >> 0x1f) >> 1)
                + 1);
  TTA::MemSetup();
  FindRunsMem(this,(this->data_compressed).bits,(int)runs,(this->data_compressed).data_width,
              (this->data_runs).runs);
  _j = (this->data_runs).runs;
  for (_end_pos = 0; _end_pos < (int)runs; _end_pos = _end_pos + 1) {
    label = 0;
    for (; local_23a = _j->start_pos, local_23a != 0xffff; _j = _j + 1) {
      local_23c = _j->end_pos;
      local_240 = TTA::MemGetLabel(_j->label);
      for (; label < (int)(uint)local_23a; label = label + 1) {
        piVar5 = MemMat<int>::operator()((MemMat<int> *)local_218,_end_pos,label);
        *piVar5 = 0;
      }
      for (; uVar4 = local_240, label < (int)(uint)local_23c; label = label + 1) {
        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,_end_pos,label);
        *puVar6 = uVar4;
      }
    }
    local_23a = 0xffff;
    for (; label < runs._4_4_; label = label + 1) {
      piVar5 = MemMat<int>::operator()((MemMat<int> *)local_218,_end_pos,label);
      *piVar5 = 0;
    }
    _j = _j + 1;
  }
  local_260 = 0;
  std::allocator<unsigned_long>::allocator(&local_261);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_258,4,&local_260,&local_261);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)img.accesses_._88_8_,
             &local_258);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_258);
  std::allocator<unsigned_long>::~allocator(&local_261);
  dVar8 = MemMat<unsigned_char>::GetTotalAccesses((MemMat<unsigned_char> *)local_e0);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)img.accesses_._88_8_,
                      0);
  *pvVar7 = (long)dVar8 | (long)(dVar8 - 9.223372036854776e+18) & (long)dVar8 >> 0x3f;
  dVar8 = MemMat<int>::GetTotalAccesses((MemMat<int> *)local_218);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)img.accesses_._88_8_,
                      1);
  *pvVar7 = (long)dVar8 | (long)(dVar8 - 9.223372036854776e+18) & (long)dVar8 >> 0x3f;
  dVar8 = TTA::MemTotalAccesses();
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)img.accesses_._88_8_,
                      2);
  *pvVar7 = (long)dVar8 | (long)(dVar8 - 9.223372036854776e+18) & (long)dVar8 >> 0x3f;
  MemMat<int>::GetImage(&local_2c8,(MemMat<int> *)local_218);
  cv::Mat_<int>::operator=
            ((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_2c8);
  cv::Mat_<int>::~Mat_(&local_2c8);
  TTA::MemDealloc();
  Runs::Dealloc(&this->data_runs);
  Data_Compressed::Dealloc(&this->data_compressed);
  MemMat<int>::~MemMat((MemMat<int> *)local_218);
  MemMat<unsigned_char>::~MemMat((MemMat<unsigned_char> *)local_e0);
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses) {
        //Data structure for memory test
        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        int w(img_.cols);
        int h(img_.rows);

        data_compressed.Alloc(h, w);
        InitCompressedDataMem(data_compressed, img);

        //find runs
        data_runs.Alloc(h, w);
        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();
        FindRunsMem(data_compressed.bits, h, data_compressed.data_width, data_runs.runs);

        Run* runs = data_runs.runs;
        for (int i = 0; i < h; i++) {
            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (; j < w; j++) img_labels(i, j) = 0;
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::MemGetLabel(runs->label);
                for (; j < start_pos; j++) img_labels(i, j) = 0;
                for (; j < end_pos; j++) img_labels(i, j) = label;
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();
        data_runs.Dealloc();
        data_compressed.Dealloc();
    }